

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTestPackages.cpp
# Opt level: O0

int __thiscall gl4cts::GL42TestPackage::init(GL42TestPackage *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  Context *pCVar2;
  GL42TestPackage *this_local;
  
  GL41TestPackage::init(&this->super_GL41TestPackage,ctx);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  MapBufferAlignmentTests::MapBufferAlignmentTests((MapBufferAlignmentTests *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  ShaderAtomicCountersTests::ShaderAtomicCountersTests((ShaderAtomicCountersTests *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  ShaderImageLoadStoreTests::ShaderImageLoadStoreTests((ShaderImageLoadStoreTests *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  ShadingLanguage420PackTests::ShadingLanguage420PackTests
            ((ShadingLanguage420PackTests *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  TextureViewTests::TextureViewTests((TextureViewTests *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void GL42TestPackage::init(void)
{
	// Call init() in parent - this creates context.
	GL41TestPackage::init();

	try
	{
		addChild(new gl4cts::MapBufferAlignmentTests(getContext()));
		addChild(new gl4cts::ShaderAtomicCountersTests(getContext()));
		addChild(new gl4cts::ShaderImageLoadStoreTests(getContext()));
		addChild(new gl4cts::ShadingLanguage420PackTests(getContext()));
		addChild(new gl4cts::TextureViewTests(getContext()));
	}
	catch (...)
	{
		// Destroy context.
		TestPackage::deinit();
		throw;
	}
}